

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server2.cpp
# Opt level: O2

int sendMessage(string *cmd,int new_fd,string *currUser,
               vector<cUser,_std::allocator<cUser>_> *currUsers,bool *msgFlags,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *msgs)

{
  pointer paVar1;
  __type _Var2;
  bool bVar3;
  ostream *poVar4;
  ssize_t sVar5;
  pointer paVar6;
  long lVar7;
  int iVar8;
  __normal_iterator<cUser_*,_std::vector<cUser,_std::allocator<cUser>_>_> __it;
  __normal_iterator<cUser_*,_std::vector<cUser,_std::allocator<cUser>_>_> _Var9;
  long lVar10;
  string local_148 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  undefined1 local_108 [8];
  string username;
  string msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  int local_94;
  vector<cUser,_std::allocator<cUser>_> *local_90;
  anon_struct_40_2_6a8bb0e8 *local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  string *local_60;
  undefined1 local_58 [8];
  cUser user;
  
  local_90 = currUsers;
  local_60 = currUser;
  std::__cxx11::string::find((char *)cmd,0x1091c9);
  std::__cxx11::string::substr((ulong)local_108,(ulong)cmd);
  std::__cxx11::string::substr((ulong)((long)&username.field_2 + 8),(ulong)cmd);
  std::__cxx11::string::string((string *)local_58,"all",(allocator *)&local_80);
  _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_108,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_58);
  std::__cxx11::string::~string((string *)local_58);
  if (_Var2) {
    std::operator+(&local_80,local_60,": ");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
                   &local_80,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&username.field_2 + 8));
    std::__cxx11::string::operator=
              ((string *)(username.field_2._M_local_buf + 8),(string *)local_58);
    std::__cxx11::string::~string((string *)local_58);
    std::__cxx11::string::~string((string *)&local_80);
    poVar4 = std::operator<<((ostream *)&std::cout,(string *)(username.field_2._M_local_buf + 8));
    std::endl<char,std::char_traits<char>>(poVar4);
    paVar1 = (local_90->super__Vector_base<cUser,_std::allocator<cUser>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    iVar8 = 1;
    for (paVar6 = (local_90->super__Vector_base<cUser,_std::allocator<cUser>_>)._M_impl.
                  super__Vector_impl_data._M_start; paVar6 != paVar1; paVar6 = paVar6 + 1) {
      anon_struct_40_2_6a8bb0e8::cUser((anon_struct_40_2_6a8bb0e8 *)local_58,paVar6);
      bVar3 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_58,local_60);
      if (bVar3) {
        std::__cxx11::string::_M_assign
                  ((string *)
                   ((msgs->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start + (int)user.username.field_2._8_4_));
        msgFlags[(int)user.username.field_2._8_4_] = true;
      }
      std::__cxx11::string::~string((string *)local_58);
    }
    goto LAB_001075f0;
  }
  __it._M_current =
       (local_90->super__Vector_base<cUser,_std::allocator<cUser>_>)._M_impl.super__Vector_impl_data
       ._M_start;
  local_88 = (local_90->super__Vector_base<cUser,_std::allocator<cUser>_>)._M_impl.
             super__Vector_impl_data._M_finish;
  local_94 = new_fd;
  std::__cxx11::string::string(local_148,(string *)local_108);
  std::__cxx11::string::string((string *)&local_b8,local_148);
  local_80._M_string_length = local_b8._M_string_length;
  local_58 = (undefined1  [8])&user.username._M_string_length;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p == &local_b8.field_2) {
    user.username.field_2._M_allocated_capacity = local_b8.field_2._8_8_;
    local_b8._M_dataplus._M_p = (pointer)local_58;
  }
  local_b8._M_string_length = 0;
  local_b8.field_2._M_local_buf[0] = '\0';
  local_80._M_dataplus._M_p = local_b8._M_dataplus._M_p;
  if ((undefined1  [8])local_b8._M_dataplus._M_p == local_58) {
    local_80.field_2._8_8_ = user.username.field_2._M_allocated_capacity;
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  }
  user.username._M_dataplus._M_p = (pointer)0x0;
  user.username._M_string_length = (ulong)(uint7)local_b8.field_2._M_allocated_capacity._1_7_ << 8;
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::~string((string *)local_58);
  std::__cxx11::string::string((string *)local_58,(string *)&local_80);
  lVar7 = (long)local_88 - (long)__it._M_current;
  for (lVar10 = lVar7 / 0x28 >> 2; 0 < lVar10; lVar10 = lVar10 + -1) {
    bVar3 = __gnu_cxx::__ops::
            _Iter_pred<sendMessage(std::__cxx11::string,int,std::__cxx11::string_const&,std::vector<cUser,std::allocator<cUser>>&,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::$_0>
            ::operator()((_Iter_pred<sendMessage(std::__cxx11::string,int,std::__cxx11::string_const&,std::vector<cUser,std::allocator<cUser>>&,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::__0>
                          *)local_58,__it);
    _Var9._M_current = __it._M_current;
    if (bVar3) goto LAB_00107479;
    bVar3 = __gnu_cxx::__ops::
            _Iter_pred<sendMessage(std::__cxx11::string,int,std::__cxx11::string_const&,std::vector<cUser,std::allocator<cUser>>&,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::$_0>
            ::operator()((_Iter_pred<sendMessage(std::__cxx11::string,int,std::__cxx11::string_const&,std::vector<cUser,std::allocator<cUser>>&,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::__0>
                          *)local_58,__it._M_current + 1);
    _Var9._M_current = __it._M_current + 1;
    if (bVar3) goto LAB_00107479;
    bVar3 = __gnu_cxx::__ops::
            _Iter_pred<sendMessage(std::__cxx11::string,int,std::__cxx11::string_const&,std::vector<cUser,std::allocator<cUser>>&,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::$_0>
            ::operator()((_Iter_pred<sendMessage(std::__cxx11::string,int,std::__cxx11::string_const&,std::vector<cUser,std::allocator<cUser>>&,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::__0>
                          *)local_58,__it._M_current + 2);
    _Var9._M_current = __it._M_current + 2;
    if (bVar3) goto LAB_00107479;
    bVar3 = __gnu_cxx::__ops::
            _Iter_pred<sendMessage(std::__cxx11::string,int,std::__cxx11::string_const&,std::vector<cUser,std::allocator<cUser>>&,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::$_0>
            ::operator()((_Iter_pred<sendMessage(std::__cxx11::string,int,std::__cxx11::string_const&,std::vector<cUser,std::allocator<cUser>>&,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::__0>
                          *)local_58,__it._M_current + 3);
    _Var9._M_current = __it._M_current + 3;
    if (bVar3) goto LAB_00107479;
    __it._M_current = __it._M_current + 4;
    lVar7 = lVar7 + -0xa0;
  }
  lVar7 = lVar7 / 0x28;
  if (lVar7 == 1) {
LAB_00107463:
    bVar3 = __gnu_cxx::__ops::
            _Iter_pred<sendMessage(std::__cxx11::string,int,std::__cxx11::string_const&,std::vector<cUser,std::allocator<cUser>>&,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::$_0>
            ::operator()((_Iter_pred<sendMessage(std::__cxx11::string,int,std::__cxx11::string_const&,std::vector<cUser,std::allocator<cUser>>&,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::__0>
                          *)local_58,__it);
    _Var9._M_current = local_88;
    if (bVar3) {
      _Var9._M_current = __it._M_current;
    }
  }
  else if (lVar7 == 2) {
LAB_00107444:
    bVar3 = __gnu_cxx::__ops::
            _Iter_pred<sendMessage(std::__cxx11::string,int,std::__cxx11::string_const&,std::vector<cUser,std::allocator<cUser>>&,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::$_0>
            ::operator()((_Iter_pred<sendMessage(std::__cxx11::string,int,std::__cxx11::string_const&,std::vector<cUser,std::allocator<cUser>>&,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::__0>
                          *)local_58,__it);
    _Var9._M_current = __it._M_current;
    if (!bVar3) {
      __it._M_current = __it._M_current + 1;
      goto LAB_00107463;
    }
  }
  else {
    _Var9._M_current = local_88;
    if ((lVar7 == 3) &&
       (bVar3 = __gnu_cxx::__ops::
                _Iter_pred<sendMessage(std::__cxx11::string,int,std::__cxx11::string_const&,std::vector<cUser,std::allocator<cUser>>&,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::$_0>
                ::operator()((_Iter_pred<sendMessage(std::__cxx11::string,int,std::__cxx11::string_const&,std::vector<cUser,std::allocator<cUser>>&,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::__0>
                              *)local_58,__it), _Var9._M_current = __it._M_current, !bVar3)) {
      __it._M_current = __it._M_current + 1;
      goto LAB_00107444;
    }
  }
LAB_00107479:
  std::__cxx11::string::~string((string *)local_58);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string(local_148);
  if (_Var9._M_current ==
      (local_90->super__Vector_base<cUser,_std::allocator<cUser>_>)._M_impl.super__Vector_impl_data.
      _M_finish) {
    iVar8 = 0;
    sVar5 = send(local_94,"Invalid UserID to send message",0x20,0);
    if (sVar5 == -1) {
      perror("Another send error bro");
    }
  }
  else {
    std::operator+(&local_128,local_60," (to ");
    std::operator+(&local_b8,&local_128,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108);
    std::operator+(&local_80,&local_b8,"): ");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
                   &local_80,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&username.field_2 + 8));
    poVar4 = std::operator<<((ostream *)&std::cout,(string *)local_58);
    std::endl<char,std::char_traits<char>>(poVar4);
    std::__cxx11::string::~string((string *)local_58);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_128);
    std::operator+(&local_80,local_60,": ");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
                   &local_80,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&username.field_2 + 8));
    std::__cxx11::string::operator=
              ((string *)(username.field_2._M_local_buf + 8),(string *)local_58);
    std::__cxx11::string::~string((string *)local_58);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::_M_assign
              ((string *)
               ((msgs->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start + (_Var9._M_current)->id));
    msgFlags[(_Var9._M_current)->id] = true;
    iVar8 = 1;
  }
LAB_001075f0:
  std::__cxx11::string::~string((string *)(username.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_108);
  return iVar8;
}

Assistant:

int sendMessage(string cmd, int new_fd, const string& currUser, vector<cUser>& currUsers,
 bool* msgFlags, vector<string>& msgs){
    //find where the space is int he
    size_t spacePos = cmd.find(" ");
    //pull out the username to send the message to
    string username = cmd.substr(0,spacePos);
    // pull out th message from the command string
    string msg = cmd.substr(spacePos+1);


    //handle the boadcast case
    if(username == string("all")){
        msg = currUser + ": " + msg;

        cout << msg << endl;

        //set all loged in users message flags and add the message to their queue
        for(cUser user : currUsers){
            if(user.username != currUser){
                msgs[user.id] = msg;
                msgFlags[user.id] = true;
            }
        }
        return 1;
    }

    // check if the message is being sent to a logged in user
    auto it = find_if(currUsers.begin(), currUsers.end(),[username](cUser u){
        return (u.username == username);
    });

    //if the user is logged in set the flag and add the message to their queue
    if(it != currUsers.end()){

        cout << currUser + " (to " + username + "): " + msg << endl;

        msg = currUser + ": " + msg;
        msgs[it->id] = msg;
        msgFlags[it->id] = true;

        return 1;
    }

    //send and error if the user is not logged in
    if(send(new_fd, "Invalid UserID to send message", 32, 0) == -1)
        perror("Another send error bro");

    return 0;
}